

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O1

bool is_sort(vector<int,_std::allocator<int>_> *arr,int len,Order type)

{
  int *piVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = len < 2;
  if (type == DESC) {
    if (len < 2) {
      return bVar2;
    }
    piVar1 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (*piVar1 < piVar1[1]) {
      return bVar2;
    }
    uVar3 = 2;
    do {
      uVar4 = uVar3;
      if ((uint)len == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (piVar1[uVar4] <= piVar1[uVar4 - 1]);
  }
  else {
    if (len < 2) {
      return bVar2;
    }
    piVar1 = (arr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar1[1] < *piVar1) {
      return bVar2;
    }
    uVar3 = 2;
    do {
      uVar4 = uVar3;
      if ((uint)len == uVar4) break;
      uVar3 = uVar4 + 1;
    } while (piVar1[uVar4 - 1] <= piVar1[uVar4]);
  }
  return (uint)len <= uVar4;
}

Assistant:

bool is_sort(vector<int> arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}